

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

void __thiscall duckdb::TableScanState::TableScanState(TableScanState *this)

{
  CollectionScanState::CollectionScanState(&this->table_state,this);
  CollectionScanState::CollectionScanState(&this->local_state,this);
  (this->options).force_fetch_row = false;
  (this->filters).column_has_filter.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->filters).column_has_filter.super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish + 8) = 0;
  (this->filters).base_column_has_filter.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->filters).base_column_has_filter.super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish + 8) = 0;
  (this->filters).column_has_filter.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->filters).base_column_has_filter.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->filters).base_column_has_filter.super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start + 8) = 0;
  (this->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->checkpoint_lock).internal.
  super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->checkpoint_lock).internal.
  super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filters).table_filters.ptr = (TableFilterSet *)0x0;
  (this->filters).adaptive_filter.
  super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
  super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>.
  super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl = (AdaptiveFilter *)0x0;
  *(uint *)((long)&(this->filters).column_has_filter.super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start + 8) = 0;
  (this->filters).filter_list.super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
  super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).filter_list.super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
  super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters).filter_list.super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
  super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filters).column_has_filter.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->filters).base_column_has_filter.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->filters).always_true_filters = 0;
  (this->sampling_info).do_system_sample = false;
  return;
}

Assistant:

TableScanState::TableScanState() : table_state(*this), local_state(*this) {
}